

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVector.h
# Opt level: O1

void chrono::XdirToDxDyDz<double>
               (ChVector<double> *Vxdir,ChVector<double> *Vsingular,ChVector<double> *Vx,
               ChVector<double> *Vy,ChVector<double> *Vz)

{
  double dVar1;
  undefined8 uVar2;
  double dVar3;
  bool bVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  
  dVar10 = Vxdir->m_data[0];
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar10;
  if ((((dVar10 != 0.0) || (NAN(dVar10))) || (Vxdir->m_data[1] != 0.0)) ||
     (((NAN(Vxdir->m_data[1]) || (Vxdir->m_data[2] != 0.0)) || (NAN(Vxdir->m_data[2]))))) {
    dVar3 = Vxdir->m_data[1];
    dVar1 = Vxdir->m_data[2];
    auVar35._8_8_ = 0;
    auVar35._0_8_ = dVar1;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar3 * dVar3;
    auVar29 = vfmadd231sd_fma(auVar11,auVar29,auVar29);
    auVar29 = vfmadd231sd_fma(auVar29,auVar35,auVar35);
    if (auVar29._0_8_ < 0.0) {
      dVar9 = sqrt(auVar29._0_8_);
    }
    else {
      auVar29 = vsqrtsd_avx(auVar29,auVar29);
      dVar9 = auVar29._0_8_;
    }
    bVar4 = 2.2250738585072014e-308 <= dVar9;
    dVar9 = 1.0 / dVar9;
    Vx->m_data[0] =
         (double)((ulong)bVar4 * (long)(dVar10 * dVar9) + (ulong)!bVar4 * 0x3ff0000000000000);
    Vx->m_data[1] = (double)((ulong)bVar4 * (long)(dVar3 * dVar9));
    Vx->m_data[2] = (double)((ulong)bVar4 * (long)(dVar1 * dVar9));
  }
  else {
    Vx->m_data[0] = 1.0;
    Vx->m_data[1] = 0.0;
    Vx->m_data[2] = 0.0;
  }
  auVar12._8_8_ = 0;
  auVar12._0_8_ = Vsingular->m_data[0];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = Vsingular->m_data[1];
  auVar24._8_8_ = 0;
  auVar24._0_8_ = Vx->m_data[0];
  auVar30._8_8_ = 0;
  auVar30._0_8_ = Vx->m_data[1];
  auVar33._8_8_ = 0;
  auVar33._0_8_ = Vsingular->m_data[0] * Vx->m_data[1];
  auVar11 = vfmsub231sd_fma(auVar33,auVar24,auVar18);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = Vx->m_data[2];
  auVar38._8_8_ = 0;
  auVar38._0_8_ = Vsingular->m_data[2];
  auVar25._8_8_ = 0;
  auVar25._0_8_ = Vsingular->m_data[2] * Vx->m_data[0];
  auVar29 = vfmsub231sd_fma(auVar25,auVar36,auVar12);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = Vsingular->m_data[1] * Vx->m_data[2];
  auVar35 = vfmsub231sd_fma(auVar19,auVar30,auVar38);
  Vz->m_data[0] = auVar35._0_8_;
  dVar10 = auVar29._0_8_;
  Vz->m_data[1] = dVar10;
  Vz->m_data[2] = auVar11._0_8_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar10 * dVar10;
  auVar29 = vfmadd231sd_fma(auVar13,auVar35,auVar35);
  auVar29 = vfmadd231sd_fma(auVar29,auVar11,auVar11);
  if (auVar29._0_8_ < 0.0) {
    dVar10 = sqrt(auVar29._0_8_);
  }
  else {
    auVar29 = vsqrtsd_avx(auVar29,auVar29);
    dVar10 = auVar29._0_8_;
  }
  if (dVar10 < 0.0001) {
    auVar14._8_8_ = 0;
    auVar14._0_8_ = Vsingular->m_data[0];
    auVar20._8_8_ = 0;
    auVar20._0_8_ = Vsingular->m_data[1];
    auVar26._8_8_ = 0;
    auVar26._0_8_ = Vsingular->m_data[2];
    auVar31._8_8_ = 0x7fffffffffffffff;
    auVar31._0_8_ = 0x7fffffffffffffff;
    auVar29 = vandpd_avx(auVar14,auVar31);
    bVar4 = auVar29._0_8_ < 0.9;
    auVar29 = vandpd_avx(auVar20,auVar31);
    bVar5 = auVar29._0_8_ < 0.9;
    dVar10 = (double)((ulong)!bVar4 * (ulong)bVar5 * 0x3ff0000000000000);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar10;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (ulong)bVar4 * 0x3ff0000000000000;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = Vx->m_data[0];
    auVar41._8_8_ = 0;
    auVar41._0_8_ = Vx->m_data[1];
    auVar42._8_8_ = 0;
    auVar42._0_8_ = Vx->m_data[1] * (double)((ulong)bVar4 * 0x3ff0000000000000);
    auVar11 = vfmsub231sd_fma(auVar42,auVar40,auVar6);
    auVar43._8_8_ = 0;
    auVar43._0_8_ = Vx->m_data[2];
    auVar29 = vandpd_avx(auVar26,auVar31);
    uVar2 = vcmpsd_avx512f(auVar29,ZEXT816(0x3feccccccccccccd),1);
    dVar3 = (double)((ulong)!bVar5 * (ulong)!bVar4 * (ulong)((byte)uVar2 & 1) * 0x3ff0000000000000);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = dVar3;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = dVar3 * Vx->m_data[0];
    auVar29 = vfmsub231sd_fma(auVar27,auVar43,auVar7);
    auVar21._8_8_ = 0;
    auVar21._0_8_ = Vx->m_data[2] * dVar10;
    auVar35 = vfmsub231sd_fma(auVar21,auVar41,auVar8);
    Vz->m_data[0] = auVar35._0_8_;
    dVar10 = auVar29._0_8_;
    Vz->m_data[1] = dVar10;
    Vz->m_data[2] = auVar11._0_8_;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = dVar10 * dVar10;
    auVar29 = vfmadd231sd_fma(auVar15,auVar35,auVar35);
    auVar29 = vfmadd231sd_fma(auVar29,auVar11,auVar11);
    if (auVar29._0_8_ < 0.0) {
      dVar10 = sqrt(auVar29._0_8_);
    }
    else {
      auVar29 = vsqrtsd_avx(auVar29,auVar29);
      dVar10 = auVar29._0_8_;
    }
  }
  dVar10 = 1.0 / dVar10;
  dVar3 = dVar10 * Vz->m_data[2];
  dVar1 = dVar10 * Vz->m_data[1];
  dVar10 = dVar10 * Vz->m_data[0];
  Vz->m_data[0] = dVar10;
  Vz->m_data[1] = dVar1;
  Vz->m_data[2] = dVar3;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = Vx->m_data[0];
  auVar34._8_8_ = 0;
  auVar34._0_8_ = Vx->m_data[1];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar10;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = Vx->m_data[0] * dVar1;
  auVar29 = vfmsub231sd_fma(auVar37,auVar16,auVar34);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = Vx->m_data[2];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = Vx->m_data[2] * dVar10;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar3;
  auVar11 = vfmsub231sd_fma(auVar17,auVar22,auVar32);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = Vx->m_data[1] * dVar3;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar1;
  auVar35 = vfmsub231sd_fma(auVar23,auVar28,auVar39);
  Vy->m_data[0] = auVar35._0_8_;
  Vy->m_data[1] = auVar11._0_8_;
  Vy->m_data[2] = auVar29._0_8_;
  return;
}

Assistant:

void XdirToDxDyDz(const ChVector<RealA>& Vxdir,
                  const ChVector<RealA>& Vsingular,
                  ChVector<RealA>& Vx,
                  ChVector<RealA>& Vy,
                  ChVector<RealA>& Vz) {
    ChVector<RealA> mVnull(0, 0, 0);
    double zlen;

    if (Vequal(Vxdir, mVnull))
        Vx = ChVector<RealA>(1, 0, 0);
    else
        Vx = Vnorm(Vxdir);

    Vz = Vcross(Vx, Vsingular);
    zlen = Vlength(Vz);

    // If close to singularity, change reference vector
    if (zlen < 0.0001) {
        ChVector<> mVsingular;
        if (std::abs(Vsingular.z()) < 0.9)
            mVsingular = ChVector<RealA>(0, 0, 1);
        if (std::abs(Vsingular.y()) < 0.9)
            mVsingular = ChVector<RealA>(0, 1, 0);
        if (std::abs(Vsingular.x()) < 0.9)
            mVsingular = ChVector<RealA>(1, 0, 0);
        Vz = Vcross(Vx, mVsingular);
        zlen = Vlength(Vz);  // now should be nonzero length.
    }

    // normalize Vz
    Vz = Vmul(Vz, 1.0 / zlen);
    // compute Vy
    Vy = Vcross(Vz, Vx);
}